

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O0

void __thiscall
libtorrent::dht::dht_tracker::put_item
          (dht_tracker *this,public_key *key,function<void_(const_libtorrent::dht::item_&,_int)> *cb
          ,function<void_(libtorrent::dht::item_&)> *data_cb,string *salt)

{
  bool bVar1;
  tracker_node *this_00;
  function<void_(libtorrent::dht::item_&)> local_f8;
  _func_void_item_ptr_int_shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>_function<void_(const_libtorrent::dht::item_&,_int)>
  *local_c8;
  type local_c0;
  function<void_(const_libtorrent::dht::item_&,_int)> local_88;
  reference local_68;
  pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node> *n;
  iterator __end2;
  iterator __begin2;
  tracker_nodes_t *__range2;
  undefined1 local_40 [8];
  shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx> ctx;
  string *salt_local;
  function<void_(libtorrent::dht::item_&)> *data_cb_local;
  function<void_(const_libtorrent::dht::item_&,_int)> *cb_local;
  public_key *key_local;
  dht_tracker *this_local;
  
  ctx.
  super___shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)salt;
  std::
  map<libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node,_std::less<libtorrent::aux::listen_socket_handle>,_std::allocator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>_>
  ::size(&this->m_nodes);
  std::make_shared<libtorrent::dht::(anonymous_namespace)::put_item_ctx,int>((int *)local_40);
  __end2 = std::
           map<libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node,_std::less<libtorrent::aux::listen_socket_handle>,_std::allocator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>_>
           ::begin(&this->m_nodes);
  n = (pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>
       *)std::
         map<libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node,_std::less<libtorrent::aux::listen_socket_handle>,_std::allocator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>_>
         ::end(&this->m_nodes);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&n);
    if (!bVar1) break;
    local_68 = std::
               _Rb_tree_iterator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>
               ::operator*(&__end2);
    this_00 = &local_68->second;
    local_c8 = anon_unknown_21::put_mutable_item_callback;
    std::
    bind<void(*)(libtorrent::dht::item_const&,int,std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,std::function<void(libtorrent::dht::item_const&,int)>),std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>&,std::function<void(libtorrent::dht::item_const&,int)>&>
              (&local_c0,&local_c8,(_Placeholder<1> *)&std::placeholders::_1,
               (_Placeholder<2> *)&std::placeholders::_2,
               (shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx> *)local_40,cb);
    std::function<void(libtorrent::dht::item_const&,int)>::
    function<std::_Bind<void(*(std::_Placeholder<1>,std::_Placeholder<2>,std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,std::function<void(libtorrent::dht::item_const&,int)>))(libtorrent::dht::item_const&,int,std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,std::function<void(libtorrent::dht::item_const&,int)>)>,void>
              ((function<void(libtorrent::dht::item_const&,int)> *)&local_88,&local_c0);
    std::function<void_(libtorrent::dht::item_&)>::function(&local_f8,data_cb);
    dht::node::put_item(&this_00->dht,key,salt,&local_88,&local_f8);
    std::function<void_(libtorrent::dht::item_&)>::~function(&local_f8);
    std::function<void_(const_libtorrent::dht::item_&,_int)>::~function(&local_88);
    std::
    _Bind<void_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>))(const_libtorrent::dht::item_&,_int,_std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>,_std::function<void_(const_libtorrent::dht::item_&,_int)>)>
    ::~_Bind(&local_c0);
    std::
    _Rb_tree_iterator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>
    ::operator++(&__end2);
  }
  std::shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx>::~shared_ptr
            ((shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx> *)local_40);
  return;
}

Assistant:

void dht_tracker::put_item(public_key const& key
		, std::function<void(item const&, int)> cb
		, std::function<void(item&)> data_cb, std::string salt)
	{
		auto ctx = std::make_shared<put_item_ctx>(int(m_nodes.size()));
		for (auto& n : m_nodes)
			n.second.dht.put_item(key, salt, std::bind(&put_mutable_item_callback
				, _1, _2, ctx, cb), data_cb);
	}